

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

string * __thiscall
pfederc::SafeExpr::toString_abi_cxx11_(string *__return_storage_ptr__,SafeExpr *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_30 [2];
  long local_20 [2];
  
  (*((this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
     _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(local_30);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x121d26);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SafeExpr::toString() const noexcept {
  return "safe " + getExpression().toString();
}